

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Neighbor_allgatherv
              (void *sendbuf,int sendcount,MPIABI_Datatype sendtype,void *recvbuf,int *recvcounts,
              int *displs,MPIABI_Datatype recvtype,MPIABI_Comm comm)

{
  int iVar1;
  
  iVar1 = MPI_Neighbor_allgatherv();
  return iVar1;
}

Assistant:

int MPIABI_Neighbor_allgatherv(
  const void * sendbuf,
  int sendcount,
  MPIABI_Datatype sendtype,
  void * recvbuf,
  const int * recvcounts,
  const int * displs,
  MPIABI_Datatype recvtype,
  MPIABI_Comm comm
) {
  return MPI_Neighbor_allgatherv(
    sendbuf,
    sendcount,
    (MPI_Datatype)(WPI_Datatype)sendtype,
    recvbuf,
    recvcounts,
    displs,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    (MPI_Comm)(WPI_Comm)comm
  );
}